

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O0

JFSON * __thiscall JFSON::esc_abi_cxx11_(JFSON *this,char c)

{
  allocator local_1e;
  char local_1d [8];
  char buf [12];
  char c_local;
  
  buf[4] = c;
  unique0x100000ca = this;
  if (((byte)c < 0x20) || (0x7f < (byte)c)) {
    snprintf(local_1d,0xc,"(%d)",(ulong)(uint)(int)c);
  }
  else {
    snprintf(local_1d,0xc,"\'%c\' (%d)",(ulong)(uint)(int)c,(ulong)(uint)(int)c);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,local_1d,&local_1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  return this;
}

Assistant:

static inline string esc(char c) {
    char buf[12];
    if (static_cast<uint8_t>(c) >= 0x20 && static_cast<uint8_t>(c) <= 0x7f) {
        snprintf(buf, sizeof buf, "'%c' (%d)", c, c);
    } else {
        snprintf(buf, sizeof buf, "(%d)", c);
    }
    return string(buf);
}